

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

uint16_t parseNumber(char **string,char *errPrefix,uint16_t errVal)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  byte bVar7;
  ushort uVar8;
  uint16_t uVar9;
  char *pcVar10;
  byte *pbVar11;
  byte bVar12;
  
  pbVar1 = (byte *)*string;
  bVar7 = *pbVar1;
  lVar6 = 1;
  bVar2 = 10;
  pbVar11 = pbVar1;
  if (bVar7 < 0x25) {
    if (bVar7 == 0x24) goto LAB_00105d1f;
    if (bVar7 == 0) {
      error("%s: expected number, but found nothing",errPrefix);
      return errVal;
    }
  }
  else {
    if (bVar7 == 0x25) {
LAB_00105d9d:
      pbVar11 = pbVar1 + lVar6;
      *string = (char *)pbVar11;
      bVar7 = pbVar1[lVar6];
      if ((bVar7 & 0xfe) != 0x30) {
        pcVar10 = " after base";
        goto LAB_00105e4c;
      }
      bVar12 = 1;
      bVar2 = 2;
      goto LAB_00105dba;
    }
    if (bVar7 == 0x30) {
      bVar7 = pbVar1[1];
      lVar6 = 2;
      if (bVar7 < 0x62) {
        if (bVar7 == 0x42) goto LAB_00105d9d;
        if (bVar7 == 0x58) goto LAB_00105d1f;
      }
      else if (bVar7 == 0x78) {
LAB_00105d1f:
        *string = (char *)(pbVar1 + lVar6);
        bVar2 = 0x10;
        pbVar11 = pbVar1 + lVar6;
      }
      else if (bVar7 == 0x62) goto LAB_00105d9d;
    }
  }
  bVar7 = *pbVar11;
  if ((byte)(bVar7 - 0x30) < 10) {
    bVar12 = 0;
LAB_00105dba:
    uVar9 = 0;
    uVar8 = (ushort)bVar2;
    do {
      pbVar11 = pbVar11 + 1;
      bVar3 = bVar7 - 0x30;
      if ((bool)(bVar12 & 1 < bVar3)) {
        return uVar9;
      }
      if (9 < bVar3) {
        if (bVar2 != 0x10) {
          return uVar9;
        }
        iVar5 = tolower((uint)bVar7);
        if (5 < (iVar5 + 0x9fU & 0xfe)) {
          return uVar9;
        }
        bVar3 = (char)iVar5 + 0xa9;
        if (bVar3 == 0xff) {
          return uVar9;
        }
      }
      *string = (char *)pbVar11;
      uVar9 = uVar9 * uVar8 + (ushort)bVar3;
      if ((ushort)(0xffff / uVar8) <= uVar9) {
        error("%s: the number is too large!",errPrefix,(ulong)(ushort)(0xffff % (uint)uVar8));
        return errVal;
      }
      bVar7 = *pbVar11;
    } while (bVar7 != 0);
    return uVar9;
  }
  pcVar10 = " after base";
  if (bVar2 == 0x10) {
    uVar4 = tolower((uint)bVar7);
    if (((uVar4 + 0x9f & 0xfe) < 6) && ((uVar4 & 0xff) != 0x56)) {
      bVar12 = 0;
      bVar2 = 0x10;
      goto LAB_00105dba;
    }
  }
  else if (bVar2 == 10) {
    pcVar10 = "";
  }
LAB_00105e4c:
  error("%s: expected digit%s, but found nothing",errPrefix,pcVar10);
  return errVal;
}

Assistant:

static uint16_t parseNumber(char *&string, char const *errPrefix, uint16_t errVal = UINT16_MAX) {
	uint8_t base = 10;
	if (*string == '\0') {
		error("%s: expected number, but found nothing", errPrefix);
		return errVal;
	} else if (*string == '$') {
		base = 16;
		++string;
	} else if (*string == '%') {
		base = 2;
		++string;
	} else if (*string == '0' && string[1] != '\0') {
		// Check if we have a "0x" or "0b" here
		if (string[1] == 'x' || string[1] == 'X') {
			base = 16;
			string += 2;
		} else if (string[1] == 'b' || string[1] == 'B') {
			base = 2;
			string += 2;
		}
	}

	/*
	 * Turns a digit into its numeric value in the current base, if it has one.
	 * Maximum is inclusive. The string_view is modified to "consume" all digits.
	 * Returns 255 on parse failure (including wrong char for base), in which case
	 * the string_view may be pointing on garbage.
	 */
	auto charIndex = [&base](unsigned char c) -> uint8_t {
		unsigned char index = c - '0'; // Use wrapping semantics
		if (base == 2 && index >= 2) {
			return 255;
		} else if (index < 10) {
			return index;
		} else if (base != 16) {
			return 255; // Letters are only valid in hex
		}
		index = tolower(c) - 'a'; // OK because we pass an `unsigned char`
		if (index < 6) {
			return index + 10;
		}
		return 255;
	};

	if (charIndex(*string) == 255) {
		error("%s: expected digit%s, but found nothing", errPrefix,
		      base != 10 ? " after base" : "");
		return errVal;
	}
	uint16_t number = 0;
	do {
		// Read a character, and check if it's valid in the given base
		uint8_t index = charIndex(*string);
		if (index == 255) {
			break; // Found an invalid character, end
		}
		++string;

		number *= base;
		number += index;
		// The lax check covers the addition on top of the multiplication
		if (number >= UINT16_MAX / base) {
			error("%s: the number is too large!", errPrefix);
			return errVal;
		}
	} while (*string != '\0'); // No more characters?

	return number;
}